

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O2

boolean save_marker(j_decompress_ptr cinfo)

{
  code cVar1;
  int iVar2;
  jpeg_marker_reader *pjVar3;
  jpeg_source_mgr *pjVar4;
  jpeg_error_mgr *pjVar5;
  jpeg_saved_marker_ptr_conflict pjVar6;
  boolean bVar7;
  jpeg_marker_parser_method *pp_Var8;
  jpeg_saved_marker_ptr_conflict pjVar9;
  size_t sVar10;
  ulong uVar11;
  code *pcVar12;
  code *pcVar13;
  jpeg_saved_marker_ptr data;
  uint datalen;
  ulong uVar14;
  ulong local_48;
  jpeg_saved_marker_ptr local_38;
  
  pjVar3 = cinfo->marker;
  local_38 = (jpeg_saved_marker_ptr)pjVar3[6].read_markers;
  pjVar4 = cinfo->src;
  pcVar12 = (code *)pjVar4->next_input_byte;
  sVar10 = pjVar4->bytes_in_buffer;
  if (local_38 == (jpeg_saved_marker_ptr)0x0) {
    if (sVar10 == 0) {
      bVar7 = (*pjVar4->fill_input_buffer)(cinfo);
      if (bVar7 == 0) {
        return 0;
      }
      pcVar12 = (code *)pjVar4->next_input_byte;
      sVar10 = pjVar4->bytes_in_buffer;
    }
    cVar1 = *pcVar12;
    sVar10 = sVar10 - 1;
    if (sVar10 == 0) {
      bVar7 = (*pjVar4->fill_input_buffer)(cinfo);
      if (bVar7 == 0) {
        return 0;
      }
      pcVar13 = (code *)pjVar4->next_input_byte;
      sVar10 = pjVar4->bytes_in_buffer;
    }
    else {
      pcVar13 = pcVar12 + 1;
    }
    sVar10 = sVar10 - 1;
    pcVar12 = pcVar13 + 1;
    local_48 = ((ulong)(byte)cVar1 * 0x100 + (ulong)(byte)*pcVar13) - 2;
    uVar11 = 0;
    if (((ulong)(byte)cVar1 * 0x100 | (ulong)(byte)*pcVar13) < 2) {
      local_38 = (jpeg_saved_marker_ptr)0x0;
      uVar14 = 0;
      data = (jpeg_saved_marker_ptr)0x0;
    }
    else {
      pp_Var8 = (jpeg_marker_parser_method *)
                ((long)pjVar3 + (long)cinfo->unread_marker * 4 + -0x2cc);
      if ((long)cinfo->unread_marker == 0xfe) {
        pp_Var8 = &pjVar3[4].read_restart_marker;
      }
      uVar14 = (ulong)*(uint *)pp_Var8;
      if ((uint)local_48 <= *(uint *)pp_Var8) {
        uVar14 = local_48 & 0xffffffff;
      }
      local_38 = (jpeg_saved_marker_ptr)
                 (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,uVar14 + 0x20);
      local_38->next = (jpeg_saved_marker_ptr)0x0;
      local_38->marker = (UINT8)*(code *)&cinfo->unread_marker;
      local_38->original_length = (uint)local_48;
      local_38->data_length = (uint)uVar14;
      data = local_38 + 1;
      local_38->data = (JOCTET *)data;
      pjVar3[6].read_markers = (_func_int_j_decompress_ptr *)local_38;
      *(undefined4 *)&pjVar3[6].read_restart_marker = 0;
    }
  }
  else {
    uVar11 = (ulong)*(uint *)&pjVar3[6].read_restart_marker;
    uVar14 = (ulong)local_38->data_length;
    data = (jpeg_saved_marker_ptr)(local_38->data + uVar11);
    local_48 = 0;
  }
  do {
    datalen = (uint)uVar14;
    if (datalen <= (uint)uVar11) {
      if (local_38 != (jpeg_saved_marker_ptr)0x0) {
        pjVar6 = cinfo->marker_list;
        if (cinfo->marker_list == (jpeg_saved_marker_ptr_conflict)0x0) {
          pjVar9 = (jpeg_saved_marker_ptr_conflict)&cinfo->marker_list;
        }
        else {
          do {
            pjVar9 = pjVar6;
            pjVar6 = pjVar9->next;
          } while (pjVar9->next != (jpeg_saved_marker_ptr)0x0);
        }
        pjVar9->next = local_38;
        data = (jpeg_saved_marker_ptr)local_38->data;
        local_48 = (ulong)(local_38->original_length - datalen);
      }
      pjVar3[6].read_markers = (_func_int_j_decompress_ptr *)0x0;
      iVar2 = cinfo->unread_marker;
      if (iVar2 == 0xee) {
        examine_app14(cinfo,(JOCTET *)data,datalen,local_48);
      }
      else if (iVar2 == 0xe0) {
        examine_app0(cinfo,(JOCTET *)data,datalen,local_48);
      }
      else {
        pjVar5 = cinfo->err;
        pjVar5->msg_code = 0x5b;
        (pjVar5->msg_parm).i[0] = iVar2;
        (cinfo->err->msg_parm).i[1] = datalen + (int)local_48;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      }
      pjVar4->next_input_byte = (JOCTET *)pcVar12;
      pjVar4->bytes_in_buffer = sVar10;
      if (0 < (long)local_48) {
        (*cinfo->src->skip_input_data)(cinfo,local_48);
      }
      return 1;
    }
    pjVar4->next_input_byte = (JOCTET *)pcVar12;
    pjVar4->bytes_in_buffer = sVar10;
    *(uint *)&pjVar3[6].read_restart_marker = (uint)uVar11;
    if (sVar10 == 0) {
      bVar7 = (*pjVar4->fill_input_buffer)(cinfo);
      if (bVar7 == 0) {
        return 0;
      }
      pcVar12 = (code *)pjVar4->next_input_byte;
      sVar10 = pjVar4->bytes_in_buffer;
    }
    while( true ) {
      if ((datalen <= (uint)uVar11) || (sVar10 == 0)) break;
      cVar1 = *pcVar12;
      pcVar12 = pcVar12 + 1;
      *(code *)&data->next = cVar1;
      data = (jpeg_saved_marker_ptr)((long)&data->next + 1);
      uVar11 = (ulong)((uint)uVar11 + 1);
      sVar10 = sVar10 - 1;
    }
  } while( true );
}

Assistant:

METHODDEF(boolean)
save_marker(j_decompress_ptr cinfo)
/* Save an APPn or COM marker into the marker list */
{
  my_marker_ptr marker = (my_marker_ptr)cinfo->marker;
  jpeg_saved_marker_ptr cur_marker = marker->cur_marker;
  unsigned int bytes_read, data_length;
  JOCTET *data;
  JLONG length = 0;
  INPUT_VARS(cinfo);

  if (cur_marker == NULL) {
    /* begin reading a marker */
    INPUT_2BYTES(cinfo, length, return FALSE);
    length -= 2;
    if (length >= 0) {          /* watch out for bogus length word */
      /* figure out how much we want to save */
      unsigned int limit;
      if (cinfo->unread_marker == (int)M_COM)
        limit = marker->length_limit_COM;
      else
        limit = marker->length_limit_APPn[cinfo->unread_marker - (int)M_APP0];
      if ((unsigned int)length < limit)
        limit = (unsigned int)length;
      /* allocate and initialize the marker item */
      cur_marker = (jpeg_saved_marker_ptr)
        (*cinfo->mem->alloc_large) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                    sizeof(struct jpeg_marker_struct) + limit);
      cur_marker->next = NULL;
      cur_marker->marker = (UINT8)cinfo->unread_marker;
      cur_marker->original_length = (unsigned int)length;
      cur_marker->data_length = limit;
      /* data area is just beyond the jpeg_marker_struct */
      data = cur_marker->data = (JOCTET *)(cur_marker + 1);
      marker->cur_marker = cur_marker;
      marker->bytes_read = 0;
      bytes_read = 0;
      data_length = limit;
    } else {
      /* deal with bogus length word */
      bytes_read = data_length = 0;
      data = NULL;
    }
  } else {
    /* resume reading a marker */
    bytes_read = marker->bytes_read;
    data_length = cur_marker->data_length;
    data = cur_marker->data + bytes_read;
  }

  while (bytes_read < data_length) {
    INPUT_SYNC(cinfo);          /* move the restart point to here */
    marker->bytes_read = bytes_read;
    /* If there's not at least one byte in buffer, suspend */
    MAKE_BYTE_AVAIL(cinfo, return FALSE);
    /* Copy bytes with reasonable rapidity */
    while (bytes_read < data_length && bytes_in_buffer > 0) {
      *data++ = *next_input_byte++;
      bytes_in_buffer--;
      bytes_read++;
    }
  }

  /* Done reading what we want to read */
  if (cur_marker != NULL) {     /* will be NULL if bogus length word */
    /* Add new marker to end of list */
    if (cinfo->marker_list == NULL) {
      cinfo->marker_list = cur_marker;
    } else {
      jpeg_saved_marker_ptr prev = cinfo->marker_list;
      while (prev->next != NULL)
        prev = prev->next;
      prev->next = cur_marker;
    }
    /* Reset pointer & calc remaining data length */
    data = cur_marker->data;
    length = cur_marker->original_length - data_length;
  }
  /* Reset to initial state for next marker */
  marker->cur_marker = NULL;

  /* Process the marker if interesting; else just make a generic trace msg */
  switch (cinfo->unread_marker) {
  case M_APP0:
    examine_app0(cinfo, data, data_length, length);
    break;
  case M_APP14:
    examine_app14(cinfo, data, data_length, length);
    break;
  default:
    TRACEMS2(cinfo, 1, JTRC_MISC_MARKER, cinfo->unread_marker,
             (int)(data_length + length));
    break;
  }

  /* skip any remaining data -- could be lots */
  INPUT_SYNC(cinfo);            /* do before skip_input_data */
  if (length > 0)
    (*cinfo->src->skip_input_data) (cinfo, (long)length);

  return TRUE;
}